

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Level.h
# Opt level: O3

void __thiscall sortNode::sortNode(sortNode *this)

{
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  this->key = 0;
  std::__cxx11::string::_M_replace((ulong)&this->value,0,(char *)0x0,0x10a1bc);
  this->timer = 0;
  this->del = false;
  return;
}

Assistant:

sortNode(){key=0;value="";timer=0;del= false;}